

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O1

void __thiscall Game::listenerThread(Game *this)

{
  GameData *this_00;
  Connection *this_01;
  int iVar1;
  SOCKET connection_id;
  Configuration *this_02;
  undefined8 uVar2;
  shared_ptr<GameState> sVar3;
  shared_ptr<Connection> connection;
  ServerSocket socket;
  DataSocket dataSocket;
  Connection *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  ServerSocket local_94;
  shared_ptr<Connection> local_88;
  Connection *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  undefined2 local_68;
  undefined6 uStack_66;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  DataSocket local_58;
  
  this_02 = GameData::GetConfiguration
                      ((this->m_game_data).super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
  iVar1 = Configuration::GetPort(this_02);
  ServerSocket::ServerSocket(&local_94,iVar1);
  ServerSocket::Listen(&local_94);
  if (this->isRunning == true) {
    do {
      ServerSocket::Accept(&local_58,&local_94);
      local_a8 = (Connection *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Connection,std::allocator<Connection>,DataSocket&>
                (&local_a0,&local_a8,(allocator<Connection> *)&local_68,&local_58);
      local_68 = 0;
      Connection::SetState(local_a8,(GameStates *)&local_68,&this->m_game_data);
      sVar3 = Connection::GetState(local_a8);
      local_78 = local_a8;
      local_70 = local_a0._M_pi;
      if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_a0._M_pi)->_M_use_count = (local_a0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_a0._M_pi)->_M_use_count = (local_a0._M_pi)->_M_use_count + 1;
        }
      }
      (**(code **)(*(long *)CONCAT62(uStack_66,local_68) + 8))
                ((long *)CONCAT62(uStack_66,local_68),&local_78,
                 sVar3.super___shared_ptr<GameState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _M_pi);
      if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
      }
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
      }
      Connection::ResetStateChanged(local_a8);
      iVar1 = pthread_mutex_lock((pthread_mutex_t *)&game_mutex);
      this_01 = local_a8;
      if (iVar1 != 0) {
        uVar2 = std::__throw_system_error(iVar1);
        ServerSocket::~ServerSocket(&local_94);
        _Unwind_Resume(uVar2);
      }
      connection_id = Connection::GetSocket(local_a8);
      Connection::SetID(this_01,connection_id);
      this->connection_id = this->connection_id + 1;
      this_00 = (this->m_game_data).super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_88.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_a8;
      local_88.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_a0._M_pi;
      if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_a0._M_pi)->_M_use_count = (local_a0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_a0._M_pi)->_M_use_count = (local_a0._M_pi)->_M_use_count + 1;
        }
      }
      GameData::AddConnection(this_00,&local_88);
      if (local_88.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      Connection::Run(local_a8);
      pthread_mutex_unlock((pthread_mutex_t *)&game_mutex);
      if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
      }
      DataSocket::~DataSocket(&local_58);
    } while (this->isRunning != false);
  }
  ServerSocket::~ServerSocket(&local_94);
  return;
}

Assistant:

void Game::listenerThread() {
    ServerSocket socket(m_game_data->GetConfiguration().GetPort());
    socket.Listen();
    while(isRunning) {
        DataSocket dataSocket = socket.Accept();
        auto connection = std::make_shared<Connection>(dataSocket);
        connection->SetState(GameStates::LOGIN, m_game_data);
        connection->GetState()->init(connection);
        connection->ResetStateChanged();
        std::lock_guard<std::mutex> guard(Game::game_mutex);
        // TODO: connection_id temporary for debugging
        // TODO: eventually connection_id could increment beyond the size of int
        connection->SetID(connection->GetSocket());
        ++connection_id;
        m_game_data->AddConnection(connection);
        connection->Run();
    }
}